

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checkregular(tetgenmesh *this,int type)

{
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  long lVar1;
  char *pcVar2;
  tetrahedron *pppdVar3;
  char *pcVar4;
  char *pcVar5;
  double dVar6;
  face checksh;
  uint local_68;
  int local_64;
  triface local_50;
  face local_40;
  
  local_40.sh = (shellface *)0x0;
  local_40.shver = 0;
  pcVar5 = "regular";
  if (this->b->quiet == 0) {
    pcVar4 = "regular";
    if ((type & 2U) == 0) {
      pcVar4 = "Delaunay";
    }
    pcVar2 = "(s)";
    if ((type & 1U) == 0) {
      pcVar2 = " ";
    }
    printf("  Checking %s %s property of the mesh...\n",pcVar4,pcVar2);
  }
  local_50.ver = 0;
  memorypool::traversalinit(this->tetrahedrons);
  local_50.tet = tetrahedrontraverse(this);
  if ((type & 2U) == 0) {
    pcVar5 = "Delaunay";
  }
  local_64 = 0;
  local_68 = 0;
  while (local_50.tet != (tetrahedron *)0x0) {
    for (local_50.ver = 0; local_50.ver < 4; local_50.ver = local_50.ver + 1) {
      pppdVar3 = (tetrahedron *)((ulong)local_50.tet[local_50.ver & 3] & 0xfffffffffffffff0);
      if (local_50.tet < pppdVar3 && pppdVar3[7] != (tetrahedron)this->dummypoint) {
        pb = local_50.tet[orgpivot[local_50.ver]];
        pa = local_50.tet[destpivot[local_50.ver]];
        pc = local_50.tet[apexpivot[local_50.ver]];
        pd = local_50.tet[oppopivot[local_50.ver]];
        pe = pppdVar3[oppopivot[fsymtbl[local_50.ver][(uint)local_50.tet[local_50.ver & 3] & 0xf]]];
        if (type == 2) {
          dVar6 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,
                           (double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3],(double)pe[3]);
        }
        else if (type == 1) {
          dVar6 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
        }
        else if (type == 0) {
          dVar6 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
        }
        else {
          dVar6 = orient4d_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,
                             (double)pa[3],(double)pb[3],(double)pc[3],(double)pd[3],(double)pe[3]);
        }
        if (0.0 < dVar6) {
          if (this->checksubfaceflag != 0) {
            tspivot(this,&local_50,&local_40);
          }
          local_64 = local_64 + 1;
          if (local_40.sh == (shellface *)0x0) {
            lVar1 = (long)this->pointmarkindex;
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",pcVar5,
                   (ulong)*(uint *)((long)pb + lVar1 * 4),(ulong)*(uint *)((long)pa + lVar1 * 4),
                   (ulong)*(uint *)((long)pc + lVar1 * 4),(ulong)*(uint *)((long)pd + lVar1 * 4),
                   *(undefined4 *)((long)pe + lVar1 * 4));
            local_68 = local_68 + 1;
          }
        }
      }
    }
    local_50.tet = tetrahedrontraverse(this);
  }
  if (local_68 == 0) {
    if (this->b->quiet == 0) {
      if (local_64 < 1) {
        pcVar4 = "  The mesh is %s.\n";
      }
      else {
        pcVar4 = "  The mesh is constrained %s.\n";
      }
      printf(pcVar4,pcVar5);
    }
  }
  else {
    printf("  !! !! !! !! Found %d non-%s faces.\n",(ulong)local_68,pcVar5);
  }
  return local_68;
}

Assistant:

int tetgenmesh::checkregular(int type)
{
  triface tetloop;
  triface symtet;
  face checksh;
  point p[5];
  REAL sign;
  int ndcount; // Count the non-locally Delaunay faces.
  int horrors;

  if (!b->quiet) {
    printf("  Checking %s %s property of the mesh...\n",
           (type & 2) == 0 ? "Delaunay" : "regular",
           (type & 1) == 0 ? " " : "(s)");
  }

  // Make sure orient3d(p[1], p[0], p[2], p[3]) > 0;
  //   Hence if (insphere(p[1], p[0], p[2], p[3], p[4]) > 0) means that
  //     p[4] lies inside the circumsphere of p[1], p[0], p[2], p[3].
  //   The same if orient4d(p[1], p[0], p[2], p[3], p[4]) > 0 means that
  //     p[4] lies below the oriented hyperplane passing through 
  //     p[1], p[0], p[2], p[3].

  ndcount = 0;
  horrors = 0;
  tetloop.ver = 0;
  // Run through the list of triangles, checking each one.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {
    // Check all four faces of the tetrahedron.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, symtet);
      // Only do test if its adjoining tet is not a hull tet or its pointer
      //   is larger (to ensure that each pair isn't tested twice).
      if (((point) symtet.tet[7] != dummypoint)&&(tetloop.tet < symtet.tet)) {
        p[0] = org(tetloop);   // pa
        p[1] = dest(tetloop);  // pb
        p[2] = apex(tetloop);  // pc
        p[3] = oppo(tetloop);  // pd
        p[4] = oppo(symtet);   // pe

        if (type == 0) {
          sign = insphere(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 1) {
          sign = insphere_s(p[1], p[0], p[2], p[3], p[4]);
        } else if (type == 2) {
          sign = orient4d(p[1],    p[0],    p[2],    p[3],    p[4], 
                          p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        } else { // type == 3
          sign = orient4d_s(p[1],    p[0],    p[2],    p[3],    p[4], 
                            p[1][3], p[0][3], p[2][3], p[3][3], p[4][3]);
        }

        if (sign > 0.0) {
          ndcount++;
          if (checksubfaceflag) {
            tspivot(tetloop, checksh);
          }
          if (checksh.sh == NULL) {
            printf("  !! Non-locally %s (%d, %d, %d) - %d, %d\n",
                   (type & 2) == 0 ? "Delaunay" : "regular",
		   pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                   pointmark(p[3]), pointmark(p[4]));
            horrors++;
          }
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (horrors == 0) {
    if (!b->quiet) {
      if (ndcount > 0) {
        printf("  The mesh is constrained %s.\n",
               (type & 2) == 0 ? "Delaunay" : "regular");
      } else {
        printf("  The mesh is %s.\n", (type & 2) == 0 ? "Delaunay" : "regular");
      } 
    }
  } else {
    printf("  !! !! !! !! Found %d non-%s faces.\n", horrors,
           (type & 2) == 0 ? "Delaunay" : "regular");
  }

  return horrors;
}